

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::IsBlockRequestedFromOutbound
          (PeerManagerImpl *this,uint256 *hash)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  char *in_R8;
  _Self __tmp;
  long in_FS_OFFSET;
  bool bVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar8;
  CNodeState *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVar8 = std::
          multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
          ::equal_range(&this->mapBlocksInFlight,hash);
  _Var4 = pVar8.first._M_node;
  bVar7 = _Var4._M_node != pVar8.second._M_node._M_node;
  if (bVar7) {
    p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    do {
      lVar2 = *(long *)(_Var4._M_node + 2);
      p_Var3 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(long)*(size_t *)(p_Var3 + 1) < lVar2]) {
        if (lVar2 <= (long)*(size_t *)(p_Var3 + 1)) {
          p_Var5 = p_Var3;
        }
      }
      p_Var6 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var6 = (_Rb_tree_header *)p_Var5,
         lVar2 < (long)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var6 = p_Var1;
      }
      local_40 = (CNodeState *)(p_Var6 + 1);
      if (p_Var6 == p_Var1) {
        local_40 = (CNodeState *)0x0;
      }
      inline_assertion_check<true,(anonymous_namespace)::CNodeState*>
                (&local_40,(char *)0x519,0xfca298,"State(nodeid)",in_R8);
      if (local_40->m_is_inbound != true) break;
      _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node);
      bVar7 = _Var4._M_node != pVar8.second._M_node._M_node;
    } while (bVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::IsBlockRequestedFromOutbound(const uint256& hash)
{
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        auto [nodeid, block_it] = range.first->second;
        CNodeState& nodestate = *Assert(State(nodeid));
        if (!nodestate.m_is_inbound) return true;
    }

    return false;
}